

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

AssertionResult * __thiscall
testing::AssertionResult::operator<<(AssertionResult *this,String *value)

{
  char cVar1;
  char *pcVar2;
  AssertionResult *pAVar3;
  bool bVar4;
  stringstream *this_00;
  long lVar5;
  size_t sVar6;
  char *pcVar7;
  char local_41;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertionResult *local_38;
  
  local_38 = this;
  this_00 = (stringstream *)operator_new(0x188);
  std::__cxx11::stringstream::stringstream(this_00);
  *(undefined8 *)(this_00 + *(long *)(*(long *)(this_00 + 0x10) + -0x18) + 0x18) = 0x11;
  pcVar2 = value->c_str_;
  local_40.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00
  ;
  if (pcVar2 == (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(this_00 + 0x10),"(null)",6);
  }
  else if (value->length_ != 0) {
    sVar6 = 0;
    do {
      cVar1 = pcVar2[sVar6];
      if (cVar1 == '\0') {
        lVar5 = 2;
        pcVar7 = "\\0";
      }
      else {
        lVar5 = 1;
        pcVar7 = &local_41;
        local_41 = cVar1;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(this_00 + 0x10),pcVar7,lVar5);
      sVar6 = sVar6 + 1;
    } while (sVar6 != value->length_);
  }
  pAVar3 = local_38;
  AppendMessage(local_38,(Message *)&local_40);
  if (((local_40.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar4 = internal::IsTrue(true), bVar4)) &&
     (local_40.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_40.ptr_ + 8))();
  }
  return pAVar3;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }